

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

bool ON_SubDVertex::Internal_GetGeneralQuadSubdivisionPoint
               (ON_SubDVertex *vertex,double *vertex_point)

{
  ON_SubDFace **ppOVar1;
  ON_SubDEdgePtr *pOVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  ON_SubDEdge *this;
  ON_SubDVertex *pOVar6;
  double dVar7;
  double dVar8;
  double a;
  double ef_weight;
  double v_weight;
  double *edgeP;
  ON_SubDVertex *edge_vertex;
  ON_SubDEdge *edge;
  uint i_1;
  ON_SubDEdgePtr *edges;
  double edgePsum [3];
  double local_98;
  double faceC [3];
  ON_SubDFace *face;
  uint i;
  ON_SubDFace **vertex_faces;
  double facePsum [3];
  double vertex_sharpness;
  ON_3dPoint sharp_subdivision_point;
  double *vertexP;
  uint n;
  double *vertex_point_local;
  ON_SubDVertex *vertex_local;
  
  if (vertex_point == (double *)0x0) {
    ON_SubDIncrementErrorCount();
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd.cpp"
               ,0x3af4,"","input vertex_point is nullptr.");
    vertex_local._7_1_ = false;
  }
  else {
    *vertex_point = ON_DBL_QNAN;
    vertex_point[1] = ON_DBL_QNAN;
    vertex_point[2] = ON_DBL_QNAN;
    if (vertex == (ON_SubDVertex *)0x0) {
      ON_SubDIncrementErrorCount();
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd.cpp"
                 ,0x3afe,"","input vertex is nullptr.");
      vertex_local._7_1_ = false;
    }
    else {
      uVar4 = (uint)vertex->m_face_count;
      if ((((vertex->m_faces == (ON_SubDFace **)0x0) || (vertex->m_edges == (ON_SubDEdgePtr *)0x0))
          || (vertex->m_face_count != vertex->m_edge_count)) ||
         (uVar5 = ON_SubDSectorType::MinimumSectorFaceCount(Smooth), uVar4 < uVar5)) {
        ON_SubDIncrementErrorCount();
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd.cpp"
                   ,0x3b09,"","input vertex is not valid.");
        vertex_local._7_1_ = false;
      }
      else {
        sharp_subdivision_point.z = (double)vertex->m_P;
        facePsum[2] = GetSharpSubdivisionPoint(vertex,(ON_3dPoint *)&vertex_sharpness);
        if (facePsum[2] < 1.0) {
          memset(&vertex_faces,0,0x18);
          ppOVar1 = vertex->m_faces;
          for (face._4_4_ = 0; face._4_4_ < uVar4; face._4_4_ = face._4_4_ + 1) {
            faceC[2] = (double)ppOVar1[face._4_4_];
            if (((ON_SubDFace *)faceC[2] == (ON_SubDFace *)0x0) ||
               (bVar3 = ON_SubDFace::GetSubdivisionPoint((ON_SubDFace *)faceC[2],&local_98), !bVar3)
               ) {
              vertex_faces = (ON_SubDFace **)
                             (*(double *)sharp_subdivision_point.z + (double)vertex_faces);
              facePsum[0] = *(double *)((long)sharp_subdivision_point.z + 8) + facePsum[0];
              facePsum[1] = *(double *)((long)sharp_subdivision_point.z + 0x10) + facePsum[1];
            }
            else {
              vertex_faces = (ON_SubDFace **)(local_98 + (double)vertex_faces);
              facePsum[0] = faceC[0] + facePsum[0];
              facePsum[1] = faceC[1] + facePsum[1];
            }
          }
          memset(&edges,0,0x18);
          pOVar2 = vertex->m_edges;
          for (edge._4_4_ = 0; edge._4_4_ < uVar4; edge._4_4_ = edge._4_4_ + 1) {
            this = (ON_SubDEdge *)(pOVar2[edge._4_4_].m_ptr & 0xfffffffffffffff8);
            if ((this == (ON_SubDEdge *)0x0) ||
               (pOVar6 = ON_SubDEdge::OtherEndVertex(this,vertex), pOVar6 == (ON_SubDVertex *)0x0))
            {
              edges = (ON_SubDEdgePtr *)(*(double *)sharp_subdivision_point.z + (double)edges);
              edgePsum[0] = *(double *)((long)sharp_subdivision_point.z + 8) + edgePsum[0];
              edgePsum[1] = *(double *)((long)sharp_subdivision_point.z + 0x10) + edgePsum[1];
            }
            else {
              edges = (ON_SubDEdgePtr *)(pOVar6->m_P[0] + (double)edges);
              edgePsum[0] = pOVar6->m_P[1] + edgePsum[0];
              edgePsum[1] = pOVar6->m_P[2] + edgePsum[1];
            }
          }
          dVar7 = -2.0 / (double)uVar4 + 1.0;
          dVar8 = 1.0 / (double)(uVar4 * uVar4);
          *vertex_point =
               dVar7 * *(double *)sharp_subdivision_point.z +
               dVar8 * ((double)edges + (double)vertex_faces);
          vertex_point[1] =
               dVar7 * *(double *)((long)sharp_subdivision_point.z + 8) +
               dVar8 * (edgePsum[0] + facePsum[0]);
          vertex_point[2] =
               dVar7 * *(double *)((long)sharp_subdivision_point.z + 0x10) +
               dVar8 * (edgePsum[1] + facePsum[1]);
          if (facePsum[2] <= 0.0) {
            vertex_local._7_1_ = true;
          }
          else {
            dVar7 = 1.0 - facePsum[2];
            *vertex_point = dVar7 * *vertex_point + facePsum[2] * vertex_sharpness;
            vertex_point[1] = dVar7 * vertex_point[1] + facePsum[2] * sharp_subdivision_point.x;
            vertex_point[2] = dVar7 * vertex_point[2] + facePsum[2] * sharp_subdivision_point.y;
            vertex_local._7_1_ = true;
          }
        }
        else {
          *vertex_point = vertex_sharpness;
          vertex_point[1] = sharp_subdivision_point.x;
          vertex_point[2] = sharp_subdivision_point.y;
          vertex_local._7_1_ = true;
        }
      }
    }
  }
  return vertex_local._7_1_;
}

Assistant:

bool ON_SubDVertex::Internal_GetGeneralQuadSubdivisionPoint(
  const class ON_SubDVertex* vertex,
  double vertex_point[3]
)
{
  if (nullptr == vertex_point)
  {
    ON_SUBD_ERROR("input vertex_point is nullptr.");
    return false;
  }

  vertex_point[0] = ON_DBL_QNAN;
  vertex_point[1] = ON_DBL_QNAN;
  vertex_point[2] = ON_DBL_QNAN;

  if (nullptr == vertex)
  {
    ON_SUBD_ERROR("input vertex is nullptr.");
    return false;
  }

  const unsigned int n = vertex->m_face_count;
  if (nullptr == vertex->m_faces
    || nullptr == vertex->m_edges
    || vertex->m_face_count != vertex->m_edge_count
    || n < ON_SubDSectorType::MinimumSectorFaceCount(ON_SubDVertexTag::Smooth)
    )
  {
    ON_SUBD_ERROR("input vertex is not valid.");
    return false;
  }

  const double* vertexP = vertex->m_P;

  ON_3dPoint sharp_subdivision_point;
  const double vertex_sharpness = vertex->GetSharpSubdivisionPoint(sharp_subdivision_point);
  if (vertex_sharpness >= 1.0)
  {
    vertex_point[0] = sharp_subdivision_point.x;
    vertex_point[1] = sharp_subdivision_point.y;
    vertex_point[2] = sharp_subdivision_point.z;
    return true;
  }

  // It is critical to use the centroids of the neighboring faces
  // in this step because the number of edges in each face's
  // boundary may not be constant.
  double facePsum[3] = {};
  const ON_SubDFace*const* vertex_faces = vertex->m_faces;
  for (unsigned int i = 0; i < n; i++)
  {
    const ON_SubDFace* face = vertex_faces[i];
    if (nullptr != face)
    {
      double faceC[3];
      if (face->GetSubdivisionPoint( faceC))
      {
        facePsum[0] += faceC[0];
        facePsum[1] += faceC[1];
        facePsum[2] += faceC[2];
        continue;
      }
    }
    // treat missing or damaged face as infinitesimally small
    facePsum[0] += vertexP[0];
    facePsum[1] += vertexP[1];
    facePsum[2] += vertexP[2];
  }

  double edgePsum[3] = {};
  class ON_SubDEdgePtr* edges = vertex->m_edges;
  for (unsigned int i = 0; i < n; i++)
  {
    const ON_SubDEdge* edge = ON_SUBD_EDGE_POINTER(edges[i].m_ptr);
    if (nullptr != edge)
    {
      const ON_SubDVertex* edge_vertex = edge->OtherEndVertex(vertex);
      if (nullptr != edge_vertex)
      {
        const double* edgeP = edge_vertex->m_P;
        edgePsum[0] += edgeP[0];
        edgePsum[1] += edgeP[1];
        edgePsum[2] += edgeP[2];
        continue;
      }
    }
    // treat missing or damaged edge as infinitesimally small
    edgePsum[0] += vertexP[0];
    edgePsum[1] += vertexP[1];
    edgePsum[2] += vertexP[2];
  }

  const double v_weight = 1.0 - 2.0 / ((double)n);
  const double ef_weight = 1.0 / ((double)(n*n));
  vertex_point[0] = v_weight*vertexP[0] + ef_weight*(edgePsum[0] + facePsum[0]);
  vertex_point[1] = v_weight*vertexP[1] + ef_weight*(edgePsum[1] + facePsum[1]);
  vertex_point[2] = v_weight*vertexP[2] + ef_weight*(edgePsum[2] + facePsum[2]);

  if (vertex_sharpness > 0.0)
  {
    // 0 < vertex_sharpness < 1
    const double a = 1.0 - vertex_sharpness;
    vertex_point[0] = a * vertex_point[0] + vertex_sharpness * sharp_subdivision_point.x;
    vertex_point[1] = a * vertex_point[1] + vertex_sharpness * sharp_subdivision_point.y;
    vertex_point[2] = a * vertex_point[2] + vertex_sharpness * sharp_subdivision_point.z;
    return true;
  }

  return true;
}